

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  undefined8 *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int **_hoffset_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  Option opt_pack1_1;
  Mat reference_blob_unpacked;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat borderm_1;
  Mat m_1;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  size_t out_elemsize_3;
  int out_elempack_3;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  size_t out_elemsize_2;
  int out_elempack_2;
  size_t out_elemsize_1;
  int out_elempack_1;
  size_t out_elemsize;
  int out_elempack;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  Mat *top_blob;
  int ref_elempack;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffff9b8;
  Mat *in_stack_fffffffffffff9c0;
  Mat *this_00;
  Mat *in_stack_fffffffffffff9c8;
  allocator_type *in_stack_fffffffffffff9d0;
  Mat *in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  Allocator *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_5c0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  int local_370;
  int local_36c;
  Mat local_368;
  undefined1 local_320 [72];
  long local_2d8;
  int local_2cc;
  int local_238;
  undefined4 local_234;
  Option *in_stack_fffffffffffffe10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffe18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffe20;
  Crop *in_stack_fffffffffffffe28;
  Mat local_170;
  Mat local_128;
  Mat local_d0;
  undefined1 local_88 [4];
  int local_84;
  undefined1 local_80 [8];
  Mat local_78;
  const_reference local_30;
  undefined8 *local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_78.cstep =
       (size_t)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_78._60_4_ = local_30->w;
  local_78.c = local_30->h;
  local_78.d = local_30->d;
  local_78.h = local_30->c;
  local_78.w = local_30->dims;
  local_78.allocator = (Allocator *)local_30->elemsize;
  local_78._28_4_ = local_30->elempack;
  local_78.elempack = ((const_reference)local_78.cstep)->elempack;
  local_78.elemsize =
       (size_t)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  if (local_78._28_4_ != 4) {
LAB_00376748:
    iVar5 = (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20);
    ncnn::Mat::Mat(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    if (local_78._28_4_ != 1) {
      local_518 = *local_28;
      local_508 = local_28[2];
      uStack_500 = local_28[3];
      local_4f8 = local_28[4];
      uStack_4f0 = local_28[5];
      local_4e8 = local_28[6];
      uStack_4e0 = local_28[7];
      uStack_510 = local_28[2];
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                      (Mat *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),iVar5,
                      (Option *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    }
    ncnn::Mat::Mat(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    if (local_78.elempack != 1) {
      local_5a8 = *local_28;
      local_598 = local_28[2];
      uStack_590 = local_28[3];
      local_588 = local_28[4];
      uStack_580 = local_28[5];
      local_578 = local_28[6];
      uStack_570 = local_28[7];
      uStack_5a0 = local_28[2];
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                      (Mat *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),iVar5,
                      (Option *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    }
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x3768b6);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               (size_type)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x3768dc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_5c0,0);
    ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_5c0,1);
    ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    local_4 = Crop::forward(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                            in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    local_234 = 1;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff9d0);
    ncnn::Mat::~Mat((Mat *)0x376985);
    ncnn::Mat::~Mat((Mat *)0x376992);
    return local_4;
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == -0xe9) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    ncnn::Mat::shape(in_stack_fffffffffffff9d8);
    piVar4 = ncnn::Mat::operator_cast_to_int_((Mat *)local_78.cstep);
    in_stack_fffffffffffff9d8 = (Mat *)local_88;
    in_stack_fffffffffffff9d0 = (allocator_type *)&local_84;
    in_stack_fffffffffffff9c8 = (Mat *)local_80;
    in_stack_fffffffffffff9c0 = (Mat *)(local_80 + 4);
    in_stack_fffffffffffff9b8 = &local_78;
    _hoffset_00 = &local_78.refcount;
    Crop::resolve_crop_roi
              ((Crop *)((long)in_RDI + lVar1),&local_d0,piVar4,(int *)((long)&local_78.refcount + 4)
               ,(int *)_hoffset_00,(int *)((long)&local_78.data + 4),
               (int *)in_stack_fffffffffffff9b8,(int *)in_stack_fffffffffffff9c0,
               (int *)in_stack_fffffffffffff9c8,(int *)in_stack_fffffffffffff9d0,
               (int *)in_stack_fffffffffffff9d8);
    ncnn::Mat::~Mat((Mat *)0x375a86);
  }
  else {
    lVar1 = *(long *)(*in_RDI + -0x18);
    ncnn::Mat::shape(in_stack_fffffffffffff9d8);
    ncnn::Mat::shape(in_stack_fffffffffffff9d8);
    in_stack_fffffffffffff9d8 = (Mat *)local_88;
    in_stack_fffffffffffff9d0 = (allocator_type *)&local_84;
    in_stack_fffffffffffff9c8 = (Mat *)local_80;
    in_stack_fffffffffffff9c0 = (Mat *)(local_80 + 4);
    in_stack_fffffffffffff9b8 = &local_78;
    _hoffset_00 = &local_78.refcount;
    Crop::resolve_crop_roi
              ((Crop *)((long)in_RDI + lVar1),&local_128,&local_170,
               (int *)((long)&local_78.refcount + 4),(int *)_hoffset_00,
               (int *)((long)&local_78.data + 4),(int *)in_stack_fffffffffffff9b8,
               (int *)in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9c8,
               (int *)in_stack_fffffffffffff9d0,(int *)in_stack_fffffffffffff9d8);
    ncnn::Mat::~Mat((Mat *)0x375b70);
    ncnn::Mat::~Mat((Mat *)0x375b7d);
  }
  iVar5 = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
  iVar6 = (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  if (local_78.w == 1) {
    iVar3 = 1;
    if ((int)local_80._4_4_ % 4 == 0) {
      iVar3 = 4;
    }
    if (((int)local_80._4_4_ / iVar3 == local_78._60_4_) && (iVar3 == 4)) {
      ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      return 0;
    }
    if ((local_78.refcount._4_4_ % 4 == 0) && (iVar3 == 4)) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),iVar6,
                        (size_t)in_stack_fffffffffffff9d0,iVar5,
                        (Allocator *)in_stack_fffffffffffff9c0);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9c0);
      if (!bVar2) {
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                       (Mat *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                       (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                       (int)in_stack_fffffffffffff9f0);
        return 0;
      }
      return -100;
    }
  }
  if (local_78.w == 2) {
    iVar3 = 1;
    if ((int)local_80._0_4_ % 4 == 0) {
      iVar3 = 4;
    }
    if (((local_80._4_4_ == local_78._60_4_) && ((int)local_80._0_4_ / iVar3 == local_78.c)) &&
       (iVar3 == 4)) {
      ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      return 0;
    }
    if (((int)local_78.refcount % 4 == 0) && (iVar3 == 4)) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),iVar6,
                        (int)in_stack_fffffffffffff9d8,(size_t)in_stack_fffffffffffff9d0,iVar5,
                        (Allocator *)in_stack_fffffffffffff9c0);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9c0);
      if (!bVar2) {
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                       (Mat *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                       (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                       (int)in_stack_fffffffffffff9f0);
        return 0;
      }
      return -100;
    }
  }
  if (local_78.w == 3) {
    iVar5 = 1;
    if ((int)local_88 % 4 == 0) {
      iVar5 = 4;
    }
    if (((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) &&
       (((int)local_88 / iVar5 == local_78.h && (iVar5 == 4)))) {
      ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      return 0;
    }
    if (((int)local_78.data % 4 == 0) && (iVar5 == 4)) {
      iVar5 = (int)local_88 / 4;
      ncnn::Mat::channel_range
                ((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0);
      iVar6 = (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20);
      if ((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) {
        ncnn::Mat::clone((Mat *)&stack0xfffffffffffffdd0,(__fn *)&stack0xfffffffffffffe18,
                         (void *)0x0,iVar5,_hoffset_00);
        ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        ncnn::Mat::~Mat((Mat *)0x376033);
        bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9c0);
        if (bVar2) {
          local_4 = -100;
          goto LAB_00376248;
        }
      }
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                        (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                        (int)in_stack_fffffffffffff9d8,iVar6,(size_t)in_stack_fffffffffffff9c8,
                        (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),in_stack_fffffffffffff9f0);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9c0);
      if (bVar2) {
        local_4 = -100;
      }
      else {
        for (local_238 = 0; local_238 < *(int *)(local_78.elemsize + 0x38);
            local_238 = local_238 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                             in_stack_fffffffffffff9e4);
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                             in_stack_fffffffffffff9e4);
          crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                         (Mat *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                         (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                         (int)in_stack_fffffffffffff9f0);
          ncnn::Mat::~Mat((Mat *)0x3761c9);
          ncnn::Mat::~Mat((Mat *)0x3761d6);
        }
        local_4 = 0;
      }
LAB_00376248:
      local_234 = 1;
      ncnn::Mat::~Mat((Mat *)0x376255);
      return local_4;
    }
  }
  if (local_78.w != 4) goto LAB_00376748;
  local_2cc = 1;
  if ((int)local_88 % 4 == 0) {
    local_2cc = 4;
  }
  local_2d8 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_2cc;
  if ((((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) &&
      (local_84 == local_78.d)) && (((int)local_88 / local_2cc == local_78.h && (local_2cc == 4))))
  {
    ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    return 0;
  }
  if (((int)local_78.data % 4 != 0) || (local_2cc != 4)) goto LAB_00376748;
  iVar5 = (int)local_78.data / 4;
  iVar6 = (int)local_88 / 4;
  ncnn::Mat::channel_range
            ((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0);
  if (((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) &&
     (local_84 == local_78.d)) {
    ncnn::Mat::clone(&local_368,(__fn *)local_320,(void *)0x0,iVar6,_hoffset_00);
    ncnn::Mat::operator=(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    ncnn::Mat::~Mat((Mat *)0x376420);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9c0);
    in_stack_fffffffffffffa00 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa00);
    if (bVar2) {
      local_4 = -100;
      goto LAB_00376720;
    }
  }
  this_00 = (Mat *)local_28[1];
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                    (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),(int)in_stack_fffffffffffff9d8,
                    (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20),(int)in_stack_fffffffffffff9d0,
                    (size_t)in_stack_fffffffffffff9c8,(int)in_stack_fffffffffffff9f0,
                    (Allocator *)CONCAT44(local_80._0_4_,in_stack_fffffffffffff9f8));
  bVar2 = ncnn::Mat::empty(this_00);
  uVar7 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff9f8);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    iVar6 = local_80._0_4_;
    for (local_36c = 0; local_36c < *(int *)(local_78.elemsize + 0x38); local_36c = local_36c + 1) {
      for (local_370 = 0; local_370 < local_84; local_370 = local_370 + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                           in_stack_fffffffffffff9e4);
        ncnn::Mat::depth(in_stack_fffffffffffff9c8,(int)((ulong)this_00 >> 0x20));
        ncnn::Mat::~Mat((Mat *)0x3765c5);
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                           in_stack_fffffffffffff9e4);
        ncnn::Mat::depth(in_stack_fffffffffffff9c8,(int)((ulong)this_00 >> 0x20));
        ncnn::Mat::~Mat((Mat *)0x37660e);
        crop_pack4_sse((Mat *)CONCAT44(iVar5,in_stack_fffffffffffffa00),(Mat *)CONCAT44(iVar6,uVar7)
                       ,(int)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                       (int)in_stack_fffffffffffff9f0);
        ncnn::Mat::~Mat((Mat *)0x376640);
        ncnn::Mat::~Mat((Mat *)0x37664d);
      }
    }
    local_4 = 0;
  }
LAB_00376720:
  local_234 = 1;
  ncnn::Mat::~Mat((Mat *)0x37672d);
  return local_4;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}